

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2LFO::tick(V2LFO *this)

{
  uint32_t uVar1;
  float fVar2;
  float local_14;
  uint32_t x;
  float v;
  V2LFO *this_local;
  
  switch(this->mode & 7) {
  case 0:
  default:
    local_14 = utof23(this->cntr);
    break;
  case 1:
    local_14 = utof23(this->cntr << 1 ^ (int)this->cntr >> 0x1f);
    break;
  case 2:
    local_14 = utof23((int)this->cntr >> 0x1f);
    break;
  case 3:
    fVar2 = utof23(this->cntr);
    fVar2 = fastsinrc(fVar2 * 6.2831855);
    local_14 = fVar2 * 0.5 + 0.5;
    break;
  case 4:
    if (this->cntr < this->last) {
      uVar1 = urandom(&this->nseed);
      this->nseed = uVar1;
    }
    this->last = this->cntr;
    local_14 = utof23(this->nseed);
  }
  this->out = local_14 * this->gain + this->dc;
  this->cntr = this->freq + this->cntr;
  if ((this->cntr < (uint)this->freq) && ((this->eg & 1U) != 0)) {
    this->cntr = 0xffffffff;
  }
  return;
}

Assistant:

void tick()
    {
        float v;
        uint32_t x;

        switch (mode & 7)
        {
        case SAW:
        default:
            COVER("LFO saw");
            v = utof23(cntr);
            break;

        case TRI:
            COVER("LFO tri");
            x = (cntr << 1) ^ (int32_t(cntr) >> 31);
            v = utof23(x);
            break;

        case PULSE:
            COVER("LFO pulse");
            x = int32_t(cntr) >> 31;
            v = utof23(x);
            break;

        case SIN:
            COVER("LFO sin");
            v = utof23(cntr);
            v = fastsinrc(v * fc2pi) * 0.5f + 0.5f;
            break;

        case S_H:
            COVER("LFO sample+hold");
            if (cntr < last)
                nseed = urandom(&nseed);
            last = cntr;
            v = utof23(nseed);
            break;
        }

        out = v * gain + dc;
        cntr += freq;
        if (cntr < (uint32_t)freq && eg) // in one-shot mode, clamp at wrap-around
            cntr = ~0u;

        DEBUG_PLOT_VAL(this, out / 128.0f);
    }